

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_9bfa9f::ConvertUnit(DataType *dt,ConversionData *conv)

{
  bool bVar1;
  ENTITY *this;
  IfcNamedUnit *unit_00;
  bad_cast *anon_var_0;
  IfcNamedUnit *unit;
  ENTITY *e;
  ConversionData *conv_local;
  DataType *dt_local;
  
  this = Assimp::STEP::EXPRESS::DataType::To<Assimp::STEP::EXPRESS::ENTITY>(dt);
  unit_00 = Assimp::STEP::EXPRESS::DataType::ResolveSelect<Assimp::IFC::Schema_2x3::IfcNamedUnit>
                      ((DataType *)this,conv->db);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(unit_00->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)
                           .field_0x18,"LENGTHUNIT");
  if ((!bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(unit_00->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                               field_0x18,"PLANEANGLEUNIT"), !bVar1)) {
    ConvertUnit(unit_00,conv);
  }
  return;
}

Assistant:

void ConvertUnit(const ::Assimp::STEP::EXPRESS::DataType& dt,ConversionData& conv)
{
    try {
        const ::Assimp::STEP::EXPRESS::ENTITY& e = dt.To<::Assimp::STEP::EXPRESS::ENTITY>();

        const Schema_2x3::IfcNamedUnit& unit = e.ResolveSelect<Schema_2x3::IfcNamedUnit>(conv.db);
        if(unit.UnitType != "LENGTHUNIT" && unit.UnitType != "PLANEANGLEUNIT") {
            return;
        }

        ConvertUnit(unit,conv);
    }
    catch(std::bad_cast&) {
        // not entity, somehow
        IFCImporter::LogError("skipping unknown IfcUnit entry - expected entity");
    }
}